

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerializer.cpp
# Opt level: O1

void __thiscall SimpleSerializer::Clear(SimpleSerializer *this,ObjectId ownerId)

{
  iterator iVar1;
  _Rb_tree_node_base *p_Var2;
  key_type local_20;
  
  local_20.m_ConstructorId = ownerId.m_ConstructorId;
  local_20.m_PerTypeId = ownerId.m_PerTypeId;
  iVar1 = std::
          _Rb_tree<ObjectId,_std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>,_std::_Select1st<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>,_std::less<ObjectId>,_std::allocator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>_>
          ::find(&(this->m_map)._M_t,&local_20);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->m_map)._M_t._M_impl.super__Rb_tree_header) {
    for (p_Var2 = iVar1._M_node[2]._M_parent;
        p_Var2 != (_Rb_tree_node_base *)&iVar1._M_node[1]._M_right;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (*(long **)(p_Var2 + 2) != (long *)0x0) {
        (**(code **)(**(long **)(p_Var2 + 2) + 8))();
      }
    }
  }
  return;
}

Assistant:

void SimpleSerializer::Clear(ObjectId ownerId)
{
	TSerializationMap::iterator found = m_map.find(ownerId);
	if (found != m_map.end())
	{
		TValueGroup::iterator it = found->second.begin();
		while (it != found->second.end())
		{
			delete it->second;
			++it;
		}
	}
}